

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::DatePart::StructOperator::Operation<duckdb::date_t>
               (bigint_vec *bigint_values,double_vec *double_values,date_t *input,idx_t idx,
               part_mask_t mask)

{
  value_type plVar1;
  value_type pdVar2;
  uint uVar3;
  int iVar4;
  reference pplVar5;
  reference ppdVar6;
  long lVar7;
  int32_t yyyy;
  int32_t mm;
  int32_t iyyy;
  int32_t ww;
  int32_t dd;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  vector<double_*,_std::allocator<double_*>_> *local_1b8;
  vector<double_*,_std::allocator<double_*>_> local_1b0;
  vector<long_*,_std::allocator<long_*>_> local_198;
  vector<double_*,_std::allocator<double_*>_> local_180;
  vector<long_*,_std::allocator<long_*>_> local_168;
  vector<long_*,_std::allocator<long_*>_> local_150;
  vector<long_*,_std::allocator<long_*>_> local_138;
  vector<long_*,_std::allocator<long_*>_> local_120;
  vector<long_*,_std::allocator<long_*>_> local_108;
  vector<long_*,_std::allocator<long_*>_> local_f0;
  vector<long_*,_std::allocator<long_*>_> local_d8;
  vector<long_*,_std::allocator<long_*>_> local_c0;
  vector<long_*,_std::allocator<long_*>_> local_a8;
  vector<long_*,_std::allocator<long_*>_> local_90;
  vector<long_*,_std::allocator<long_*>_> local_78;
  vector<long_*,_std::allocator<long_*>_> local_60;
  vector<long_*,_std::allocator<long_*>_> local_48;
  
  local_1cc = 0x7b2;
  local_1c8 = 0;
  local_1bc = 1;
  local_1b8 = &double_values->super_vector<double_*,_std::allocator<double_*>_>;
  if ((mask & 1) != 0) {
    duckdb::Date::Convert((date_t)input->days,&local_1cc,&local_1c8,&local_1bc);
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_48,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_48,0);
    plVar1 = *pplVar5;
    if (local_48.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)local_1cc;
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_60,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_60,1);
    plVar1 = *pplVar5;
    if (local_60.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)local_1c8;
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_78,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_78,2);
    plVar1 = *pplVar5;
    if (local_78.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)local_1bc;
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_90,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_90,3);
    plVar1 = *pplVar5;
    if (local_90.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)(local_1cc / 10);
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_a8,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_a8,4);
    plVar1 = *pplVar5;
    if (local_a8.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      if (local_1cc < 1) {
        uVar3 = ~((uint)-local_1cc / 100);
      }
      else {
        uVar3 = (local_1cc - 1U) / 100 + 1;
      }
      plVar1[idx] = (long)(int)uVar3;
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_c0,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_c0,5);
    plVar1 = *pplVar5;
    if (local_c0.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      if (local_1cc < 1) {
        uVar3 = ~((uint)-local_1cc / 1000);
      }
      else {
        uVar3 = (local_1cc - 1U) / 1000 + 1;
      }
      plVar1[idx] = (long)(int)uVar3;
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_d8,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_d8,0xf);
    plVar1 = *pplVar5;
    if (local_d8.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)((local_1c8 + -1) / 3 + 1);
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_f0,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_f0,0x12);
    plVar1 = *pplVar5;
    if (local_f0.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (ulong)(0 < local_1cc);
    }
  }
  if ((mask & 2) != 0) {
    iVar4 = duckdb::Date::ExtractISODayOfTheWeek((date_t)input->days);
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_108,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_108,0xb);
    plVar1 = *pplVar5;
    if (local_108.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)(iVar4 % 7);
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_120,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_120,0xc);
    plVar1 = *pplVar5;
    if (local_120.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)iVar4;
    }
  }
  if ((mask & 0x40) != 0) {
    local_1c0 = 0;
    local_1c4 = 0;
    duckdb::Date::ExtractISOYearWeek((date_t)input->days,&local_1c4,&local_1c0);
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_138,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_138,0xd);
    plVar1 = *pplVar5;
    if (local_138.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)local_1c0;
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_150,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_150,0xe);
    plVar1 = *pplVar5;
    if (local_150.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)local_1c4;
    }
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_168,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_168,0x11);
    plVar1 = *pplVar5;
    if (local_168.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      iVar4 = -local_1c0;
      if (0 < local_1c4) {
        iVar4 = local_1c0;
      }
      plVar1[idx] = (long)(iVar4 + local_1c4 * 100);
    }
  }
  if ((mask & 8) != 0) {
    std::vector<double_*,_std::allocator<double_*>_>::vector(&local_180,local_1b8);
    ppdVar6 = vector<double_*,_true>::operator[]((vector<double_*,_true> *)&local_180,0);
    pdVar2 = *ppdVar6;
    if (local_180.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (pdVar2 != (value_type)0x0) {
      lVar7 = duckdb::Date::Epoch((date_t)input->days);
      pdVar2[idx] = (double)lVar7;
    }
  }
  if ((mask & 4) != 0) {
    std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_198,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar5 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_198,0x10);
    plVar1 = *pplVar5;
    if (local_198.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      iVar4 = duckdb::Date::ExtractDayOfTheYear((date_t)input->days);
      plVar1[idx] = (long)iVar4;
    }
  }
  if ((char)mask < '\0') {
    std::vector<double_*,_std::allocator<double_*>_>::vector(&local_1b0,local_1b8);
    ppdVar6 = vector<double_*,_true>::operator[]((vector<double_*,_true> *)&local_1b0,1);
    pdVar2 = *ppdVar6;
    if (local_1b0.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b0.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (pdVar2 != (value_type)0x0) {
      lVar7 = duckdb::Date::ExtractJulianDay((date_t)input->days);
      pdVar2[idx] = (double)lVar7;
    }
  }
  return;
}

Assistant:

static inline void Operation(bigint_vec &bigint_values, double_vec &double_values, const TA &input,
		                             const idx_t idx, const part_mask_t mask) {
			int64_t *bigint_data;
			// YMD calculations
			int32_t yyyy = 1970;
			int32_t mm = 0;
			int32_t dd = 1;
			if (mask & YMD) {
				Date::Convert(input, yyyy, mm, dd);
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::YEAR);
				if (bigint_data) {
					bigint_data[idx] = yyyy;
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::MONTH);
				if (bigint_data) {
					bigint_data[idx] = mm;
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::DAY);
				if (bigint_data) {
					bigint_data[idx] = dd;
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::DECADE);
				if (bigint_data) {
					bigint_data[idx] = DecadeOperator::DecadeFromYear(yyyy);
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::CENTURY);
				if (bigint_data) {
					bigint_data[idx] = CenturyOperator::CenturyFromYear(yyyy);
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::MILLENNIUM);
				if (bigint_data) {
					bigint_data[idx] = MillenniumOperator::MillenniumFromYear(yyyy);
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::QUARTER);
				if (bigint_data) {
					bigint_data[idx] = QuarterOperator::QuarterFromMonth(mm);
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::ERA);
				if (bigint_data) {
					bigint_data[idx] = EraOperator::EraFromYear(yyyy);
				}
			}

			// Week calculations
			if (mask & DOW) {
				auto isodow = Date::ExtractISODayOfTheWeek(input);
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::DOW);
				if (bigint_data) {
					bigint_data[idx] = DayOfWeekOperator::DayOfWeekFromISO(isodow);
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::ISODOW);
				if (bigint_data) {
					bigint_data[idx] = isodow;
				}
			}

			// ISO calculations
			if (mask & ISO) {
				int32_t ww = 0;
				int32_t iyyy = 0;
				Date::ExtractISOYearWeek(input, iyyy, ww);
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::WEEK);
				if (bigint_data) {
					bigint_data[idx] = ww;
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::ISOYEAR);
				if (bigint_data) {
					bigint_data[idx] = iyyy;
				}
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::YEARWEEK);
				if (bigint_data) {
					bigint_data[idx] = YearWeekOperator::YearWeekFromParts(iyyy, ww);
				}
			}

			if (mask & EPOCH) {
				auto double_data = HasPartValue(double_values, DatePartSpecifier::EPOCH);
				if (double_data) {
					double_data[idx] = double(Date::Epoch(input));
				}
			}
			if (mask & DOY) {
				bigint_data = HasPartValue(bigint_values, DatePartSpecifier::DOY);
				if (bigint_data) {
					bigint_data[idx] = Date::ExtractDayOfTheYear(input);
				}
			}
			if (mask & JD) {
				auto double_data = HasPartValue(double_values, DatePartSpecifier::JULIAN_DAY);
				if (double_data) {
					double_data[idx] = double(Date::ExtractJulianDay(input));
				}
			}
		}